

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O3

void ChangeSpy(int changespy)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  AActor *listenactor;
  uint uVar7;
  
  if (gamestate != GS_LEVEL) {
    return;
  }
  uVar3 = (ulong)consoleplayer;
  if (*(long *)((&DAT_017e1fb8)[uVar3 * 0x54] + 0x230) == 0) {
    if (demoplayback) {
      return;
    }
    Net_WriteByte('B');
    return;
  }
  if ((dmflags2.Value._2_1_ & 0x10) != 0) {
    return;
  }
  uVar6 = uVar3;
  if (changespy != 0) {
    bVar4 = deathmatch.Value == 0 || demoplayback;
    uVar6 = (ulong)(uint)((int)(*(long *)((&DAT_017e1fb8)[uVar3 * 0x54] + 0x230) - 0x17e1e40U >> 5)
                         * 0x3cf3cf3d);
    iVar5 = 7;
    uVar2 = consoleplayer;
    if (changespy == 1) {
      iVar5 = 1;
    }
    do {
      uVar7 = (int)uVar6 + iVar5 & 7;
      uVar6 = (ulong)uVar7;
      if (playeringame[uVar6] == true) {
        if ((bVar4) ||
           (bVar1 = AActor::IsTeammate((AActor *)(&players)[uVar6 * 0x54],
                                       (AActor *)(&players)[(long)(int)uVar2 * 0x54]), bVar1))
        break;
        uVar2 = consoleplayer;
        if ((bot_allowspy.Value != false) && ((&DAT_017e1fd8)[uVar6 * 0x54] != 0)) {
          if ((*(byte *)((&DAT_017e1fd8)[uVar6 * 0x54] + 0x20) & 0x20) == 0) break;
          (&DAT_017e1fd8)[uVar6 * 0x54] = 0;
          uVar2 = consoleplayer;
        }
      }
    } while (uVar7 != uVar2);
    uVar3 = (ulong)consoleplayer;
  }
  listenactor = (AActor *)(&players)[uVar6 * 0x54];
  (&DAT_017e1fb8)[uVar3 * 0x54] = listenactor;
  if (listenactor != (AActor *)0x0) {
    if (((listenactor->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0038a109;
    (&DAT_017e1fb8)[uVar3 * 0x54] = 0;
  }
  listenactor = (AActor *)0x0;
LAB_0038a109:
  S_UpdateSounds(listenactor);
  (*(StatusBar->super_DObject)._vptr_DObject[10])(StatusBar,&players + uVar6 * 0x54);
  if ((demoplayback == false) && (multiplayer != true)) {
    return;
  }
  DBaseStatusBar::ShowPlayerName(StatusBar);
  return;
}

Assistant:

static void ChangeSpy (int changespy)
{
	// If you're not in a level, then you can't spy.
	if (gamestate != GS_LEVEL)
	{
		return;
	}

	// If not viewing through a player, return your eyes to your own head.
	if (players[consoleplayer].camera->player == NULL)
	{
		// When watching demos, you will just have to wait until your player
		// has done this for you, since it could desync otherwise.
		if (!demoplayback)
		{
			Net_WriteByte(DEM_REVERTCAMERA);
		}
		return;
	}

	// We may not be allowed to spy on anyone.
	if (dmflags2 & DF2_DISALLOW_SPYING)
		return;

	// Otherwise, cycle to the next player.
	bool checkTeam = !demoplayback && deathmatch;
	int pnum = consoleplayer;
	if (changespy != SPY_CANCEL) 
	{
		player_t *player = players[consoleplayer].camera->player;
		// only use the camera as starting index if it's a valid player.
		if (player != NULL) pnum = int(players[consoleplayer].camera->player - players);

		int step = (changespy == SPY_NEXT) ? 1 : -1;

		do
		{
			pnum += step;
			pnum &= MAXPLAYERS-1;
			if (playeringame[pnum] &&
				(!checkTeam || players[pnum].mo->IsTeammate (players[consoleplayer].mo) ||
				(bot_allowspy && players[pnum].Bot != NULL)))
			{
				break;
			}
		} while (pnum != consoleplayer);
	}

	players[consoleplayer].camera = players[pnum].mo;
	S_UpdateSounds(players[consoleplayer].camera);
	StatusBar->AttachToPlayer (&players[pnum]);
	if (demoplayback || multiplayer)
	{
		StatusBar->ShowPlayerName ();
	}
}